

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# io.cc
# Opt level: O1

void gimage::anon_unknown_17::loadTiledHeader
               (BasicImageIO *io,
               set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *list,string *prefix,string *suffix,long *twidth,long *theight,long *tborder,
               long *width,long *height,int *depth)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  pointer pcVar2;
  istream *piVar3;
  _Base_ptr p_Var4;
  IOException *pIVar5;
  _Rb_tree_header *p_Var6;
  int iVar7;
  int iVar8;
  char sep3;
  char sep2;
  char sep1;
  int i;
  Properties prop;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> __str;
  char local_253;
  char local_252;
  char local_251;
  string *local_250;
  string *local_248;
  long *local_240;
  int local_234;
  long *local_230;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_228;
  BasicImageIO *local_208;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_200;
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  local_1e0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1b0;
  int aiStack_190 [22];
  ios_base local_138 [264];
  
  local_248 = suffix;
  local_208 = io;
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::clear(&list->_M_t);
  *twidth = 0;
  *theight = 0;
  *tborder = 0;
  *width = 0;
  *height = 0;
  *depth = 0;
  local_1e0._M_impl.super__Rb_tree_header._M_header._M_left =
       &local_1e0._M_impl.super__Rb_tree_header._M_header;
  local_1e0._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  local_1e0._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  local_1e0._M_impl.super__Rb_tree_header._M_node_count = 0;
  paVar1 = &local_1b0.field_2;
  pcVar2 = (prefix->_M_dataplus)._M_p;
  local_250 = prefix;
  local_240 = theight;
  local_230 = twidth;
  local_1e0._M_impl.super__Rb_tree_header._M_header._M_right =
       local_1e0._M_impl.super__Rb_tree_header._M_header._M_left;
  local_1b0._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_1b0,pcVar2,pcVar2 + prefix->_M_string_length);
  std::__cxx11::string::append((char *)&local_1b0);
  gutil::Properties::load((char *)&local_1e0);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1b0._M_dataplus._M_p != paVar1) {
    operator_delete(local_1b0._M_dataplus._M_p);
  }
  pcVar2 = (local_250->_M_dataplus)._M_p;
  local_1b0._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_1b0,pcVar2,pcVar2 + local_250->_M_string_length);
  std::__cxx11::string::append((char *)&local_1b0);
  gutil::Properties::load((char *)&local_1e0);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1b0._M_dataplus._M_p != paVar1) {
    operator_delete(local_1b0._M_dataplus._M_p);
  }
  gutil::Properties::getValue<long>((Properties *)&local_1e0,"border",tborder,"0");
  gutil::getFileList((set *)list,(string *)local_250,(string *)local_248);
  if ((list->_M_t)._M_impl.super__Rb_tree_header._M_node_count == 0) {
    pIVar5 = (IOException *)__cxa_allocate_exception(0x28);
    std::operator+(&local_200,"There are no tiles: ",local_250);
    std::operator+(&local_228,&local_200,':');
    std::operator+(&local_1b0,&local_228,local_248);
    gutil::IOException::IOException(pIVar5,&local_1b0);
    __cxa_throw(pIVar5,&gutil::IOException::typeinfo,gutil::Exception::~Exception);
  }
  (*local_208->_vptr_BasicImageIO[4])
            (local_208,
             *(undefined8 *)((list->_M_t)._M_impl.super__Rb_tree_header._M_header._M_left + 1),
             local_230,theight,depth);
  p_Var4 = (list->_M_t)._M_impl.super__Rb_tree_header._M_header._M_left;
  p_Var6 = &(list->_M_t)._M_impl.super__Rb_tree_header;
  if ((_Rb_tree_header *)p_Var4 == p_Var6) {
    iVar8 = 0;
    iVar7 = 0;
  }
  else {
    iVar7 = 0;
    iVar8 = 0;
    do {
      std::__cxx11::string::substr((ulong)&local_228,(ulong)(p_Var4 + 1));
      std::__cxx11::istringstream::istringstream
                ((istringstream *)&local_1b0,(string *)&local_228,_S_in);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_228._M_dataplus._M_p != &local_228.field_2) {
        operator_delete(local_228._M_dataplus._M_p);
      }
      piVar3 = std::operator>>((istream *)&local_1b0,&local_251);
      piVar3 = (istream *)std::istream::operator>>((istream *)piVar3,&local_234);
      piVar3 = std::operator>>(piVar3,&local_252);
      piVar3 = (istream *)std::istream::operator>>((istream *)piVar3,(int *)&local_200);
      std::operator>>(piVar3,&local_253);
      if ((((*(int *)((long)aiStack_190 + *(long *)(local_1b0._M_dataplus._M_p + -0x18)) == 0) &&
           (local_251 == '_')) && (local_252 == '_')) && (local_253 == '_')) {
        if (iVar8 <= (int)local_200._M_dataplus._M_p + 1) {
          iVar8 = (int)local_200._M_dataplus._M_p + 1;
        }
        if (iVar7 <= local_234 + 1) {
          iVar7 = local_234 + 1;
        }
      }
      std::__cxx11::istringstream::~istringstream((istringstream *)&local_1b0);
      std::ios_base::~ios_base(local_138);
      p_Var4 = (_Base_ptr)std::_Rb_tree_increment(p_Var4);
    } while ((_Rb_tree_header *)p_Var4 != p_Var6);
  }
  if ((iVar8 != 0) && (iVar7 != 0)) {
    *width = (long)iVar8 * (*local_230 + *tborder * -2);
    *height = (long)iVar7 * (*local_240 + *tborder * -2);
    std::
    _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
    ::~_Rb_tree(&local_1e0);
    return;
  }
  pIVar5 = (IOException *)__cxa_allocate_exception(0x28);
  std::operator+(&local_200,"This is not a tiled image: ",local_250);
  std::operator+(&local_228,&local_200,':');
  std::operator+(&local_1b0,&local_228,local_248);
  gutil::IOException::IOException(pIVar5,&local_1b0);
  __cxa_throw(pIVar5,&gutil::IOException::typeinfo,gutil::Exception::~Exception);
}

Assistant:

void loadTiledHeader(const BasicImageIO &io, std::set<std::string> &list,
                     const std::string &prefix, const std::string &suffix, long &twidth, long &theight,
                     long &tborder, long &width, long &height, int &depth)
{
  // initialise return parameters

  list.clear();
  twidth=0;
  theight=0;
  tborder=0;
  width=0;
  height=0;
  depth=0;

  // get optional border size

  gutil::Properties prop;

  try
  {
    prop.load((prefix+".hdr").c_str());
  }
  catch (const std::exception &)
  { }

  try
  {
    prop.load((prefix+"_param.txt").c_str());
  }
  catch (const std::exception &)
  { }

  prop.getValue("border", tborder, "0");

  // get list of all tiles

  gutil::getFileList(list, prefix, suffix);

  if (list.empty())
  {
    throw gutil::IOException("There are no tiles: "+prefix+':'+suffix);
  }

  // load header information of first tile

  io.loadHeader((*list.begin()).c_str(), twidth, theight, depth);

  // determine number of rows and columns

  int rows=0;
  int cols=0;

  for (std::set<std::string>::iterator it=list.begin(); it!=list.end(); ++it)
  {
    int i, k;
    char sep1, sep2, sep3;
    std::istringstream in(it->substr(prefix.size(), it->size()-prefix.size()-suffix.size()));

    in >> sep1 >> k >> sep2 >> i >> sep3;

    if (in.good() && sep1 == '_' && sep2 == '_' && sep3 == '_')
    {
      cols=std::max(cols, i+1);
      rows=std::max(rows, k+1);
    }
  }

  if (cols == 0 || rows == 0)
  {
    throw gutil::IOException("This is not a tiled image: "+prefix+':'+suffix);
  }

  // compute total size

  width=(twidth-2*tborder)*cols;
  height=(theight-2*tborder)*rows;
}